

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
DoSetProperty_NoFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,Var instance,
          PropertyOperationFlags flags)

{
  ushort uVar1;
  undefined8 uVar2;
  bool bVar3;
  PropertyId PVar4;
  InlineCache *this_00;
  code *pcVar5;
  Var pvVar6;
  ConstructorCache *pCVar7;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(instance);
  this_00 = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  if ((flags & PropertyOperation_Root) == PropertyOperation_None) {
    pcVar5 = JavascriptOperators::PatchPutValueNoLocalFastPath<false,Js::InlineCache>;
  }
  else {
    pcVar5 = JavascriptOperators::PatchPutRootValueNoLocalFastPath<false,Js::InlineCache>;
  }
  uVar2 = *(undefined8 *)(this + 0x88);
  uVar1 = playout->inlineCacheIndex;
  PVar4 = GetPropertyIdFromCacheId(this,(uint)uVar1);
  pvVar6 = GetReg<unsigned_short>(this,playout->Value);
  (*pcVar5)(uVar2,this_00,uVar1,instance,PVar4,pvVar6,flags);
  bVar3 = TaggedNumber::Is(instance);
  if (!bVar3) {
    pCVar7 = JavascriptFunction::GetConstructorCache(*(JavascriptFunction **)(this + 0x80));
    if ((pCVar7->content).updateAfterCtor == true) {
      InlineCache::RemoveFromInvalidationListAndClear
                (this_00,*(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8));
    }
  }
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::DoSetProperty_NoFastPath(unaligned T* playout, Var instance, PropertyOperationFlags flags)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        InlineCache *const inlineCache = GetInlineCache(playout->inlineCacheIndex);

        const auto PatchPutRootValue = &JavascriptOperators::PatchPutRootValueNoLocalFastPath<false, InlineCache>;
        const auto PatchPutValue = &JavascriptOperators::PatchPutValueNoLocalFastPath<false, InlineCache>;
        const auto PatchPut = flags & PropertyOperation_Root ? PatchPutRootValue : PatchPutValue;
        PatchPut(
            GetFunctionBody(),
            inlineCache,
            playout->inlineCacheIndex,
            instance,
            GetPropertyIdFromCacheId(playout->inlineCacheIndex),
            GetReg(playout->Value),
            flags);

        if (!TaggedNumber::Is(instance) && GetJavascriptFunction()->GetConstructorCache()->NeedsUpdateAfterCtor())
        {
            // This function has only 'this' statements and is being used as a constructor. When the constructor exits, the
            // function object's constructor cache will be updated with the type produced by the constructor. From that
            // point on, when the same function object is used as a constructor, the a new object with the final type will
            // be created. Whatever is stored in the inline cache currently will cause cache misses after the constructor
            // cache update. So, just clear it now so that the caches won't be flagged as polymorphic.
            inlineCache->RemoveFromInvalidationListAndClear(this->GetScriptContext()->GetThreadContext());
        }
    }